

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O3

Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_> *
__thiscall
llvm::DWARFUnit::findRnglistFromOffset
          (Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
           *__return_storage_ptr__,DWARFUnit *this,uint64_t Offset)

{
  Optional<llvm::object::SectionedAddress> BaseAddr;
  Optional<llvm::object::SectionedAddress> BaseAddr_00;
  DWARFDataExtractor Data;
  undefined1 auVar1 [8];
  char *Msg;
  error_code EC;
  anon_union_16_2_fc7899a5_for_OptionalStorage<llvm::object::SectionedAddress,_true>_2 local_e0;
  undefined8 local_d0;
  anon_union_16_2_fc7899a5_for_OptionalStorage<llvm::object::SectionedAddress,_true>_2 local_c8;
  undefined8 local_b8;
  char *local_b0;
  size_t sStack_a8;
  undefined1 local_a0;
  undefined1 uStack_9f;
  undefined6 uStack_9e;
  DWARFObject *pDStack_98;
  DWARFSection *local_90;
  undefined1 local_88 [8];
  DWARFDebugRangeList RangeList;
  Error local_58;
  Error local_50;
  pointer local_48;
  DWARFContext *pDStack_40;
  pointer local_38;
  
  if ((this->Header).FormParams.Version < 5) {
    DWARFDebugRangeList::DWARFDebugRangeList((DWARFDebugRangeList *)local_88);
    extractRangeList((DWARFUnit *)&stack0xffffffffffffffb8,(uint64_t)this,
                     (DWARFDebugRangeList *)Offset);
    if (local_48 < (pointer)0x2) {
      getBaseAddress((Optional<llvm::object::SectionedAddress> *)&local_e0.value,this);
      BaseAddr.Storage.field_0.value.SectionIndex = local_e0.value.SectionIndex;
      BaseAddr.Storage.field_0.value.Address = local_e0.value.Address;
      BaseAddr.Storage._16_8_ = local_d0;
      DWARFDebugRangeList::getAbsoluteRanges
                ((DWARFAddressRangesVector *)&stack0xffffffffffffffb8,
                 (DWARFDebugRangeList *)local_88,BaseAddr);
      __return_storage_ptr__->field_0x18 = __return_storage_ptr__->field_0x18 & 0xfe;
      *(pointer *)&__return_storage_ptr__->field_0 = local_48;
      *(DWARFContext **)((long)&__return_storage_ptr__->field_0 + 8) = pDStack_40;
      *(pointer *)((long)&__return_storage_ptr__->field_0 + 0x10) = local_38;
    }
    else {
      RangeList.Entries.
      super__Vector_base<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((ulong)local_48 | 1);
      local_48 = (pointer)0x0;
      Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
      Expected(__return_storage_ptr__,
               (Error *)&RangeList.Entries.
                         super__Vector_base<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((long *)((ulong)RangeList.Entries.
                          super__Vector_base<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xfffffffffffffffe)
          != (long *)0x0) {
        (**(code **)(*(long *)((ulong)RangeList.Entries.
                                      super__Vector_base<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage &
                              0xfffffffffffffffe) + 8))();
      }
      if ((long *)((ulong)local_48 & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)((ulong)local_48 & 0xfffffffffffffffe) + 8))();
      }
    }
    if (RangeList._8_8_ != 0) {
      operator_delete((void *)RangeList._8_8_,
                      (long)RangeList.Entries.
                            super__Vector_base<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish - RangeList._8_8_);
    }
  }
  else if ((this->RngListTable).Storage.hasVal == true) {
    local_90 = this->RangeSection;
    pDStack_98 = (this->Context->DObj)._M_t.
                 super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                 .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
    local_a0 = this->isLittleEndian;
    uStack_9f = *(undefined1 *)((long)&(this->RngListTable).Storage.field_0 + 10);
    local_b0 = (local_90->Data).Data;
    sStack_a8 = (local_90->Data).Length;
    Data.super_DataExtractor.AddressSize = uStack_9f;
    Data.super_DataExtractor.IsLittleEndian = local_a0;
    Data.super_DataExtractor._18_6_ = uStack_9e;
    Data.super_DataExtractor.Data = local_90->Data;
    Data.Obj = pDStack_98;
    Data.Section = local_90;
    DWARFListTableBase<llvm::DWARFDebugRnglist>::findList
              ((Expected<llvm::DWARFDebugRnglist> *)local_88,
               (DWARFListTableBase<llvm::DWARFDebugRnglist> *)&this->RngListTable,Data,Offset);
    auVar1 = local_88;
    if (((byte)RangeList.Entries.
               super__Vector_base<llvm::DWARFDebugRangeList::RangeListEntry,_std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>_>
               ._M_impl.super__Vector_impl_data._M_start & 1) == 0) {
      getBaseAddress((Optional<llvm::object::SectionedAddress> *)&local_c8.value,this);
      BaseAddr_00.Storage.field_0.value.SectionIndex = local_c8.value.SectionIndex;
      BaseAddr_00.Storage.field_0.value.Address = local_c8.value.Address;
      BaseAddr_00.Storage._16_8_ = local_b8;
      DWARFDebugRnglist::getAbsoluteRanges
                ((DWARFAddressRangesVector *)&stack0xffffffffffffffb8,(DWARFDebugRnglist *)local_88,
                 BaseAddr_00,this);
      __return_storage_ptr__->field_0x18 = __return_storage_ptr__->field_0x18 & 0xfe;
      *(pointer *)(__return_storage_ptr__->field_0).ErrorStorage.buffer = local_48;
      *(DWARFContext **)((long)&__return_storage_ptr__->field_0 + 8) = pDStack_40;
      *(pointer *)((long)&__return_storage_ptr__->field_0 + 0x10) = local_38;
    }
    else {
      local_88[0] = '\0';
      local_88[1] = '\0';
      local_88[2] = '\0';
      local_88[3] = '\0';
      local_88[4] = '\0';
      local_88[5] = '\0';
      local_88[6] = '\0';
      local_88[7] = '\0';
      local_58.Payload = (ErrorInfoBase *)((ulong)auVar1 | 1);
      Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
      Expected(__return_storage_ptr__,&local_58);
      if ((long *)((ulong)local_58.Payload & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)((ulong)local_58.Payload & 0xfffffffffffffffe) + 8))();
      }
    }
    Expected<llvm::DWARFDebugRnglist>::~Expected((Expected<llvm::DWARFDebugRnglist> *)local_88);
  }
  else {
    Msg = (char *)std::_V2::generic_category();
    EC._M_cat = (error_category *)0x16;
    EC._0_8_ = &local_50;
    createStringError(EC,Msg);
    Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
    Expected(__return_storage_ptr__,&local_50);
    if ((long *)((ulong)local_50.Payload & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_50.Payload & 0xfffffffffffffffe) + 8))();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<DWARFAddressRangesVector>
DWARFUnit::findRnglistFromOffset(uint64_t Offset) {
  if (getVersion() <= 4) {
    DWARFDebugRangeList RangeList;
    if (Error E = extractRangeList(Offset, RangeList))
      return std::move(E);
    return RangeList.getAbsoluteRanges(getBaseAddress());
  }
  if (RngListTable) {
    DWARFDataExtractor RangesData(Context.getDWARFObj(), *RangeSection,
                                  isLittleEndian, RngListTable->getAddrSize());
    auto RangeListOrError = RngListTable->findList(RangesData, Offset);
    if (RangeListOrError)
      return RangeListOrError.get().getAbsoluteRanges(getBaseAddress(), *this);
    return RangeListOrError.takeError();
  }

  return createStringError(errc::invalid_argument,
                           "missing or invalid range list table");
}